

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON_String::Length(char *s,size_t string_capacity)

{
  bool bVar1;
  undefined8 local_28;
  size_t slen;
  size_t string_capacity_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    slen = string_capacity;
    if (0x7ffffffd < string_capacity) {
      slen = 0x7ffffffd;
    }
    local_28 = 0;
    string_capacity_local = (size_t)s;
    while( true ) {
      bVar1 = false;
      if (local_28 < slen) {
        bVar1 = *(char *)string_capacity_local != '\0';
        string_capacity_local = string_capacity_local + 1;
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    s_local._4_4_ = (int)local_28;
  }
  return s_local._4_4_;
}

Assistant:

int ON_String::Length(
  const char* s,
  size_t string_capacity
)
{
  if (nullptr == s)
    return 0;
  if (string_capacity > 2147483645)
    string_capacity = 2147483645;
  size_t slen = 0;
  while (slen < string_capacity && 0 != *s++)
    slen++;
  return ((int)slen);
}